

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O1

void recycle_subsps(H264_subSPS_t *subset_sps)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  
  uVar1 = subset_sps->num_views_minus1;
  if (0 < (int)uVar1) {
    lVar3 = 0;
    do {
      if (0 < *(int *)((long)subset_sps->num_anchor_refs_l0 + lVar3 + 4)) {
        pvVar2 = *(void **)((long)subset_sps->anchor_ref_l0 + lVar3 * 2 + 8);
        if (pvVar2 != (void *)0x0) {
          mpp_osal_free("recycle_subsps",pvVar2);
        }
        *(undefined8 *)((long)subset_sps->anchor_ref_l0 + lVar3 * 2 + 8) = 0;
      }
      if (0 < *(int *)((long)subset_sps->num_anchor_refs_l1 + lVar3 + 4)) {
        pvVar2 = *(void **)((long)subset_sps->anchor_ref_l1 + lVar3 * 2 + 8);
        if (pvVar2 != (void *)0x0) {
          mpp_osal_free("recycle_subsps",pvVar2);
        }
        *(undefined8 *)((long)subset_sps->anchor_ref_l1 + lVar3 * 2 + 8) = 0;
      }
      if (0 < *(int *)((long)subset_sps->num_non_anchor_refs_l0 + lVar3 + 4)) {
        pvVar2 = *(void **)((long)subset_sps->non_anchor_ref_l0 + lVar3 * 2 + 8);
        if (pvVar2 != (void *)0x0) {
          mpp_osal_free("recycle_subsps",pvVar2);
        }
        *(undefined8 *)((long)subset_sps->non_anchor_ref_l0 + lVar3 * 2 + 8) = 0;
      }
      if (0 < *(int *)((long)subset_sps->num_non_anchor_refs_l1 + lVar3 + 4)) {
        pvVar2 = *(void **)((long)subset_sps->non_anchor_ref_l1 + lVar3 * 2 + 8);
        if (pvVar2 != (void *)0x0) {
          mpp_osal_free("recycle_subsps",pvVar2);
        }
        *(undefined8 *)((long)subset_sps->non_anchor_ref_l1 + lVar3 * 2 + 8) = 0;
      }
      lVar3 = lVar3 + 4;
    } while ((ulong)uVar1 * 4 - lVar3 != 0);
  }
  if (-1 < (int)uVar1) {
    if (subset_sps->view_id != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->view_id);
    }
    subset_sps->view_id = (RK_S32 *)0x0;
    if (subset_sps->num_anchor_refs_l0 != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->num_anchor_refs_l0);
    }
    subset_sps->num_anchor_refs_l0 = (RK_S32 *)0x0;
    if (subset_sps->num_anchor_refs_l1 != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->num_anchor_refs_l1);
    }
    subset_sps->num_anchor_refs_l1 = (RK_S32 *)0x0;
    if (subset_sps->anchor_ref_l0 != (RK_S32 **)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->anchor_ref_l0);
    }
    subset_sps->anchor_ref_l0 = (RK_S32 **)0x0;
    if (subset_sps->anchor_ref_l1 != (RK_S32 **)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->anchor_ref_l1);
    }
    subset_sps->anchor_ref_l1 = (RK_S32 **)0x0;
    if (subset_sps->num_non_anchor_refs_l0 != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->num_non_anchor_refs_l0);
    }
    subset_sps->num_non_anchor_refs_l0 = (RK_S32 *)0x0;
    if (subset_sps->num_non_anchor_refs_l1 != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->num_non_anchor_refs_l1);
    }
    subset_sps->num_non_anchor_refs_l1 = (RK_S32 *)0x0;
    if (subset_sps->non_anchor_ref_l0 != (RK_S32 **)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->non_anchor_ref_l0);
    }
    subset_sps->non_anchor_ref_l0 = (RK_S32 **)0x0;
    if (subset_sps->non_anchor_ref_l1 != (RK_S32 **)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->non_anchor_ref_l1);
    }
    subset_sps->non_anchor_ref_l1 = (RK_S32 **)0x0;
  }
  subset_sps->Valid = 0;
  return;
}

Assistant:

void recycle_subsps(H264_subSPS_t *subset_sps)
{
    RK_S32 i = 0, num_views = 0;

    num_views = 1 + subset_sps->num_views_minus1;
    for (i = 1; i < num_views; i++) {
        if (subset_sps->num_anchor_refs_l0[i] > 0) {
            MPP_FREE(subset_sps->anchor_ref_l0[i]);
        }
        if (subset_sps->num_anchor_refs_l1[i] > 0) {
            MPP_FREE(subset_sps->anchor_ref_l1[i]);
        }
        if (subset_sps->num_non_anchor_refs_l0[i] > 0) {
            MPP_FREE(subset_sps->non_anchor_ref_l0[i]);
        }
        if (subset_sps->num_non_anchor_refs_l1[i] > 0) {
            MPP_FREE(subset_sps->non_anchor_ref_l1[i]);
        }
    }
    if (num_views > 0) {
        MPP_FREE(subset_sps->view_id);
        MPP_FREE(subset_sps->num_anchor_refs_l0);
        MPP_FREE(subset_sps->num_anchor_refs_l1);
        MPP_FREE(subset_sps->anchor_ref_l0);
        MPP_FREE(subset_sps->anchor_ref_l1);
        MPP_FREE(subset_sps->num_non_anchor_refs_l0);
        MPP_FREE(subset_sps->num_non_anchor_refs_l1);
        MPP_FREE(subset_sps->non_anchor_ref_l0);
        MPP_FREE(subset_sps->non_anchor_ref_l1);
    }
    subset_sps->Valid = 0;
}